

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

void __thiscall Scine::Core::ModuleManager::Impl::Impl(Impl *this)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  path *this_00;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *singlePath;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string modulePath;
  char *pathPtr;
  char pathSep;
  path coreLocationParent;
  path executableParentPath;
  undefined4 in_stack_fffffffffffffe18;
  byte in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1d;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  path *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe30;
  allocator<char> *in_stack_fffffffffffffe50;
  path *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  undefined1 local_130 [24];
  undefined1 *local_118;
  allocator<char> local_109;
  string local_108 [32];
  path *local_e8;
  undefined1 local_d9;
  path *in_stack_ffffffffffffffc8;
  Impl *in_stack_ffffffffffffffd0;
  char in_stack_fffffffffffffff7;
  
  std::
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ::vector((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
            *)0x135839);
  boost::dll::program_location();
  boost::filesystem::path::parent_path();
  boost::filesystem::path::~path((path *)0x13586c);
  tryLoadModulesInPath((Impl *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  tryAdjacentDirectories(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  boost::dll::anon_unknown_4::this_line_location();
  boost::filesystem::path::parent_path();
  boost::filesystem::path::~path((path *)0x1358c7);
  tryLoadModulesInPath((Impl *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  boost::filesystem::path::parent_path();
  boost::filesystem::path::parent_path();
  bVar3 = boost::filesystem::operator!=
                    (in_stack_fffffffffffffe20,
                     (path *)CONCAT17(in_stack_fffffffffffffe1f,
                                      CONCAT16(in_stack_fffffffffffffe1e,
                                               CONCAT15(in_stack_fffffffffffffe1d,
                                                        CONCAT14(in_stack_fffffffffffffe1c,
                                                                 in_stack_fffffffffffffe18)))));
  boost::filesystem::path::~path((path *)0x135931);
  boost::filesystem::path::~path((path *)0x13593e);
  if ((bVar3 & 1) != 0) {
    tryAdjacentDirectories(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  local_d9 = 0x3a;
  this_00 = (path *)getenv("SCINE_MODULE_PATH");
  local_e8 = this_00;
  if (this_00 != (path *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50
              );
    std::allocator<char>::~allocator(&local_109);
    Detail::split(in_RDI,in_stack_fffffffffffffff7);
    local_118 = local_130;
    local_138._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe1f,
                             CONCAT16(in_stack_fffffffffffffe1e,
                                      CONCAT15(in_stack_fffffffffffffe1d,
                                               CONCAT14(in_stack_fffffffffffffe1c,
                                                        in_stack_fffffffffffffe18)))));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffe1f,
                      CONCAT16(in_stack_fffffffffffffe1e,
                               CONCAT15(in_stack_fffffffffffffe1d,
                                        CONCAT14(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18
                                                )))));
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this_00,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe1f,
                                          CONCAT16(in_stack_fffffffffffffe1e,
                                                   CONCAT15(in_stack_fffffffffffffe1d,
                                                            CONCAT14(in_stack_fffffffffffffe1c,
                                                                     in_stack_fffffffffffffe18))))),
          bVar4) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_138);
      uVar5 = std::__cxx11::string::empty();
      bVar1 = false;
      bVar4 = false;
      bVar2 = false;
      if ((uVar5 & 1) == 0) {
        boost::filesystem::path::path
                  (this_00,(string_type *)
                           (ulong)CONCAT16(in_stack_fffffffffffffe1e,
                                           CONCAT15(in_stack_fffffffffffffe1d,
                                                    CONCAT14(in_stack_fffffffffffffe1c,
                                                             in_stack_fffffffffffffe18))));
        bVar1 = true;
        in_stack_fffffffffffffe1e = boost::filesystem::exists(this_00);
        bVar2 = false;
        if ((bool)in_stack_fffffffffffffe1e) {
          boost::filesystem::path::path
                    (this_00,(string_type *)
                             (ulong)CONCAT16(in_stack_fffffffffffffe1e,
                                             CONCAT15(in_stack_fffffffffffffe1d,
                                                      CONCAT14(in_stack_fffffffffffffe1c,
                                                               in_stack_fffffffffffffe18))));
          bVar4 = true;
          in_stack_fffffffffffffe1d = boost::filesystem::is_directory(this_00);
          bVar2 = (bool)in_stack_fffffffffffffe1d;
        }
      }
      in_stack_fffffffffffffe1c = bVar2;
      in_stack_fffffffffffffe1f = in_stack_fffffffffffffe1c;
      if (bVar4) {
        boost::filesystem::path::~path((path *)0x135c3b);
      }
      if (bVar1) {
        boost::filesystem::path::~path((path *)0x135c51);
      }
      if ((in_stack_fffffffffffffe1c & 1) != 0) {
        boost::filesystem::path::path
                  (this_00,(string_type *)
                           CONCAT17(in_stack_fffffffffffffe1f,
                                    CONCAT16(in_stack_fffffffffffffe1e,
                                             CONCAT15(in_stack_fffffffffffffe1d,
                                                      CONCAT14(in_stack_fffffffffffffe1c,
                                                               in_stack_fffffffffffffe18)))));
        tryLoadModulesInPath((Impl *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        boost::filesystem::path::~path((path *)0x135c8d);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_138);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(bVar3,in_stack_fffffffffffffe30));
    std::__cxx11::string::~string(local_108);
  }
  boost::filesystem::path::~path((path *)0x135d70);
  boost::filesystem::path::~path((path *)0x135d7d);
  return;
}

Assistant:

Impl() {
    /* Try to load modules in several paths: */
    const auto executableParentPath = boost::dll::program_location().parent_path();
    tryLoadModulesInPath(executableParentPath);
    tryAdjacentDirectories(executableParentPath);
    const auto coreLocationParent = boost::dll::this_line_location().parent_path();
    tryLoadModulesInPath(coreLocationParent);
    if (coreLocationParent.parent_path() != executableParentPath.parent_path()) {
      tryAdjacentDirectories(coreLocationParent);
    }

    // SCINE_MODULE_PATH environment variable. Path separators are os-dependent!
#ifdef _WIN32
    const char pathSep = ';';
#else
    const char pathSep = ':';
#endif

    if (const char* pathPtr = std::getenv("SCINE_MODULE_PATH")) {
      std::string modulePath = pathPtr;

      for (const auto& singlePath : Detail::split(modulePath, pathSep)) {
        if (!singlePath.empty() && boost::filesystem::exists(singlePath) && boost::filesystem::is_directory(singlePath)) {
          tryLoadModulesInPath(singlePath);
        }
      }
    }
  }